

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

void __thiscall duckdb::ParquetWriter::GatherWrittenStatistics(ParquetWriter *this)

{
  idx_t iVar1;
  ulong uVar2;
  CopyFunctionFileStatistics *pCVar3;
  pointer this_00;
  size_type sVar4;
  mapped_type *pmVar5;
  pointer pCVar6;
  pointer pCVar7;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unordered_map<basic_string<char>,_Value,_CaseInsensitiveStringHashFunction,_CaseInsensitiveStringEquality>_>_&&>::value,_pair<iterator,_bool>_>
  _Var8;
  string max_value;
  string min_value;
  case_insensitive_map_t<Value> column_stats;
  value_type *stats_unifier;
  idx_t c;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>,_true>
  in_stack_fffffffffffffbc0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>
  *__x;
  allocator local_2e1;
  string local_2e0 [32];
  Value local_2c0 [71];
  allocator local_279;
  string local_278 [32];
  Value local_258 [71];
  allocator local_211;
  string local_210 [32];
  string local_1f0 [32];
  Value local_1d0 [71];
  allocator local_189;
  string local_188 [32];
  string local_168 [32];
  Value local_148 [64];
  string local_108 [32];
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [48];
  Value local_90 [120];
  reference local_18;
  ulong local_10;
  
  iVar1 = *(idx_t *)(in_RDI + 0x120);
  pCVar3 = optional_ptr<duckdb::CopyFunctionFileStatistics,_true>::operator->
                     ((optional_ptr<duckdb::CopyFunctionFileStatistics,_true> *)
                      in_stack_fffffffffffffbc0._M_cur);
  pCVar3->row_count = iVar1;
  local_10 = 0;
  while( true ) {
    uVar2 = local_10;
    this_00 = unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
              ::operator->((unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
                            *)in_stack_fffffffffffffbc0._M_cur);
    sVar4 = std::
            vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
            ::size((vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>_>_>
                    *)this_00);
    if (sVar4 <= uVar2) break;
    unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
    ::operator->((unique_ptr<duckdb::ParquetStatsAccumulator,_std::default_delete<duckdb::ParquetStatsAccumulator>,_true>
                  *)in_stack_fffffffffffffbc0._M_cur);
    local_18 = vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur,
                            CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                     *)0x6c0f2a);
    unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>::
    operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                *)in_stack_fffffffffffffbc0._M_cur);
    duckdb::Value::UBIGINT((ulong)local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"column_size_bytes",&local_c1);
    pmVar5 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
             ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                           *)in_stack_fffffffffffffbc0._M_cur,
                          (key_type *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8))
    ;
    duckdb::Value::operator=(pmVar5,local_90);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    duckdb::Value::~Value(local_90);
    pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
             ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                           *)in_stack_fffffffffffffbc0._M_cur);
    if ((pCVar6->all_min_max_set & 1U) != 0) {
      pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur);
      pCVar7 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur);
      (*pCVar6->_vptr_ColumnStatsUnifier[3])(local_e8,pCVar6,&pCVar7->global_min);
      pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur);
      pCVar7 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur);
      (*pCVar6->_vptr_ColumnStatsUnifier[3])(local_108,pCVar6,&pCVar7->global_max);
      pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur);
      if ((pCVar6->min_is_set & 1U) != 0) {
        std::__cxx11::string::string(local_168,local_e8);
        duckdb::Value::Value(local_148,local_168);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_188,"min",&local_189);
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                               *)in_stack_fffffffffffffbc0._M_cur,
                              (key_type *)
                              CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
        duckdb::Value::operator=(pmVar5,local_148);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
        duckdb::Value::~Value(local_148);
        std::__cxx11::string::~string(local_168);
      }
      pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
               ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                             *)in_stack_fffffffffffffbc0._M_cur);
      if ((pCVar6->max_is_set & 1U) != 0) {
        std::__cxx11::string::string(local_1f0,local_108);
        duckdb::Value::Value(local_1d0,local_1f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_210,"max",&local_211);
        pmVar5 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                               *)in_stack_fffffffffffffbc0._M_cur,
                              (key_type *)
                              CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
        duckdb::Value::operator=(pmVar5,local_1d0);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        duckdb::Value::~Value(local_1d0);
        std::__cxx11::string::~string(local_1f0);
      }
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_e8);
    }
    pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
             ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                           *)in_stack_fffffffffffffbc0._M_cur);
    if ((pCVar6->all_nulls_set & 1U) != 0) {
      unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
      ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                    *)in_stack_fffffffffffffbc0._M_cur);
      duckdb::Value::UBIGINT((ulong)local_258);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_278,"null_count",&local_279);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                             *)in_stack_fffffffffffffbc0._M_cur,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      duckdb::Value::operator=(pmVar5,local_258);
      std::__cxx11::string::~string(local_278);
      std::allocator<char>::~allocator((allocator<char> *)&local_279);
      duckdb::Value::~Value(local_258);
    }
    pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
             ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                           *)in_stack_fffffffffffffbc0._M_cur);
    if ((pCVar6->can_have_nan & 1U) != 0) {
      unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
      ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                    *)in_stack_fffffffffffffbc0._M_cur);
      duckdb::Value::BOOLEAN(SUB81(local_2c0,0));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e0,"has_nan",&local_2e1);
      pmVar5 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                             *)in_stack_fffffffffffffbc0._M_cur,
                            (key_type *)
                            CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
      duckdb::Value::operator=(pmVar5,local_2c0);
      std::__cxx11::string::~string(local_2e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
      duckdb::Value::~Value(local_2c0);
    }
    pCVar3 = optional_ptr<duckdb::CopyFunctionFileStatistics,_true>::operator->
                       ((optional_ptr<duckdb::CopyFunctionFileStatistics,_true> *)
                        in_stack_fffffffffffffbc0._M_cur);
    __x = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>
           *)&pCVar3->column_statistics;
    pCVar6 = unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
             ::operator->((unique_ptr<duckdb::ColumnStatsUnifier,_std::default_delete<duckdb::ColumnStatsUnifier>,_true>
                           *)in_stack_fffffffffffffbc0._M_cur);
    std::
    make_pair<std::__cxx11::string&,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>
              (&__x->first,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)in_stack_fffffffffffffbc0._M_cur);
    _Var8 = std::
            unordered_map<std::__cxx11::string,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>>>
            ::
            insert<std::pair<std::__cxx11::string,std::unordered_map<std::__cxx11::string,duckdb::Value,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>>>>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>_>_>
                        *)pCVar6,__x);
    in_stack_fffffffffffffbc0._M_cur =
         (__node_type *)
         _Var8.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>,_true>
         ._M_cur;
    in_stack_fffffffffffffbbf = _Var8.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>_>
             *)in_stack_fffffffffffffbc0._M_cur);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                      *)0x6c1770);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void ParquetWriter::GatherWrittenStatistics() {
	written_stats->row_count = file_meta_data.num_rows;

	// finalize the min/max values and write to column stats
	for (idx_t c = 0; c < stats_accumulator->stats_unifiers.size(); c++) {
		auto &stats_unifier = stats_accumulator->stats_unifiers[c];
		case_insensitive_map_t<Value> column_stats;
		column_stats["column_size_bytes"] = Value::UBIGINT(stats_unifier->column_size_bytes);
		if (stats_unifier->all_min_max_set) {
			auto min_value = stats_unifier->StatsToString(stats_unifier->global_min);
			auto max_value = stats_unifier->StatsToString(stats_unifier->global_max);
			if (stats_unifier->min_is_set) {
				column_stats["min"] = min_value;
			}
			if (stats_unifier->max_is_set) {
				column_stats["max"] = max_value;
			}
		}
		if (stats_unifier->all_nulls_set) {
			column_stats["null_count"] = Value::UBIGINT(stats_unifier->null_count);
		}
		if (stats_unifier->can_have_nan) {
			column_stats["has_nan"] = Value::BOOLEAN(stats_unifier->has_nan);
		}
		written_stats->column_statistics.insert(make_pair(stats_unifier->column_name, std::move(column_stats)));
	}
}